

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O0

void test_AString_replaceRangeAString_success_indexAndRangeBeyondSize_bufferExpanded_fn(int _i)

{
  AString string_00;
  AString string_01;
  bool bVar1;
  int iVar2;
  char *in_stack_fffffffffffffea0;
  uintmax_t _ck_y_6;
  uintmax_t _ck_x_8;
  uintmax_t _ck_y_5;
  uintmax_t _ck_x_7;
  char *_ck_y_q_1;
  char *_ck_x_q_1;
  char *_ck_y_s_1;
  char *_ck_x_s_1;
  char *_ck_y_4;
  char *_ck_x_6;
  void *_ck_x_5;
  uintmax_t _ck_y_3;
  uintmax_t _ck_x_4;
  uintmax_t _ck_y_2;
  uintmax_t _ck_x_3;
  char *_ck_y_q;
  char *_ck_x_q;
  char *_ck_y_s;
  char *_ck_x_s;
  char *_ck_y_1;
  char *_ck_x_2;
  void *_ck_x_1;
  uintmax_t _ck_y;
  uintmax_t _ck_x;
  AString replacement;
  AString string;
  int _i_local;
  
  private_ACUtilsTest_AString_constructTestString((AString *)&replacement.buffer,"012345",8);
  private_ACUtilsTest_AString_constructTestString((AString *)&_ck_x,"678",3);
  private_ACUtilsTest_AString_setReallocFail(false,0);
  bVar1 = AString_replaceRangeAString((AString *)&replacement.buffer,0x2a,0x29a,(AString *)&_ck_x);
  if (bVar1 == false) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x704,
                      "Assertion \'AString_replaceRangeAString(&string, 42, 666, &replacement)\' failed"
                      ,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x704);
  if (string.size != 0x10) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x705,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju","(string).capacity == (16)",
                      "(string).capacity",string.size,"(16)",0x10,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x705);
  if (string.capacity == 0) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x705,"Assertion \'_ck_x != NULL\' failed",
                      "Assertion \'%s\' failed: %s == %#x","(void*) (string).buffer != NULL",
                      "(void*) (string).buffer",0,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x705);
  if (string.capacity == 0) {
    _ck_y_q = "";
    _ck_y_s = "(null)";
  }
  else {
    _ck_y_q = "\"";
    iVar2 = strcmp("012345678",(char *)string.capacity);
    _ck_y_s = (char *)string.capacity;
    if (iVar2 == 0) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x705);
      if (string.deallocator != (ACUtilsDeallocator)0x9) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x705,"Assertion \'_ck_x == _ck_y\' failed",
                          "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                          "(string).size == strlen(\"012345678\")","(string).size",
                          string.deallocator,"strlen(\"012345678\")",9,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x705);
      if (replacement.size != 3) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x706,"Assertion \'_ck_x == _ck_y\' failed",
                          "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                          "(replacement).capacity == (3)","(replacement).capacity",replacement.size,
                          "(3)",3,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x706);
      if (replacement.capacity == 0) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x706,"Assertion \'_ck_x != NULL\' failed",
                          "Assertion \'%s\' failed: %s == %#x",
                          "(void*) (replacement).buffer != NULL","(void*) (replacement).buffer",0,0)
        ;
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x706);
      _ck_y_s_1 = (char *)replacement.capacity;
      if (replacement.capacity == 0) {
        _ck_y_q_1 = "";
        _ck_y_s_1 = "(null)";
      }
      else {
        _ck_y_q_1 = "\"";
        iVar2 = strcmp("678",(char *)replacement.capacity);
        if (iVar2 == 0) {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x706);
          if (replacement.deallocator != (ACUtilsDeallocator)0x3) {
            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x706,"Assertion \'_ck_x == _ck_y\' failed",
                              "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                              "(replacement).size == strlen(\"678\")","(replacement).size",
                              replacement.deallocator,"strlen(\"678\")",3,0);
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x706);
          if (private_ACUtilsTest_AString_reallocCount == 1) {
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x707);
            string_00.deallocator = (ACUtilsDeallocator)0x9;
            string_00.reallocator = string.reallocator;
            string_00.size = 0x10;
            string_00.capacity = string.capacity;
            string_00.buffer = in_stack_fffffffffffffea0;
            private_ACUtilsTest_AString_destructTestString(string_00);
            string_01.deallocator = replacement.deallocator;
            string_01.reallocator = replacement.reallocator;
            string_01.size = replacement.size;
            string_01.capacity = replacement.capacity;
            string_01.buffer = in_stack_fffffffffffffea0;
            private_ACUtilsTest_AString_destructTestString(string_01);
            return;
          }
          _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0x707,"Assertion \'_ck_x == _ck_y\' failed",
                            "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                            "private_ACUtilsTest_AString_reallocCount == (1)",
                            "private_ACUtilsTest_AString_reallocCount",
                            private_ACUtilsTest_AString_reallocCount,"(1)",1,0);
        }
      }
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x706,
                        "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                        ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                        "(replacement).buffer == (\"678\")","(replacement).buffer",_ck_y_q_1,
                        _ck_y_s_1,_ck_y_q_1,"(\"678\")","\"","678","\"",0);
    }
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x705,
                    "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                    ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                    "(string).buffer == (\"012345678\")","(string).buffer",_ck_y_q,_ck_y_s,_ck_y_q,
                    "(\"012345678\")","\"","012345678","\"",0);
}

Assistant:

END_TEST
START_TEST(test_AString_replaceRangeAString_success_indexAndRangeBeyondSize_bufferExpanded)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("012345", 8);
    struct AString replacement = private_ACUtilsTest_AString_constructTestString("678", 3);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    ACUTILSTEST_ASSERT(AString_replaceRangeAString(&string, 42, 666, &replacement));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "012345678", 16);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(replacement, "678", 3);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(1);
    private_ACUtilsTest_AString_destructTestString(string);
    private_ACUtilsTest_AString_destructTestString(replacement);
}